

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O1

bool __thiscall
SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount>::Has
          (SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount> *this,
          ModuleRecordBase *data)

{
  SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  code *pcVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  undefined4 *puVar5;
  Type *ppMVar6;
  undefined1 local_40 [8];
  Iterator iter;
  
  local_40 = (undefined1  [8])this;
  iter.list = this;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (iter.list == (SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    auVar3 = local_40;
    pSVar1 = (SListBase<Js::ModuleRecordBase_*,_Memory::ArenaAllocator,_RealCount> *)
             ((iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
  } while (((undefined1  [8])pSVar1 != local_40) &&
          (iter.list = pSVar1, ppMVar6 = Iterator::Data((Iterator *)local_40), *ppMVar6 != data));
  return (undefined1  [8])pSVar1 != auVar3;
}

Assistant:

bool Has(TData data) const
    {
        Iterator iter(this);
        while (iter.Next())
        {
            if (iter.Data() == data)
            {
                return true;
            }
        }
        return false;
    }